

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O2

ixy_device * ixy_init(char *pci_addr,uint16_t rx_queues,uint16_t tx_queues,int interrupt_timeout)

{
  uint16_t uVar1;
  uint16_t uVar2;
  int fd;
  ssize_t sVar3;
  ixy_device *piVar4;
  undefined1 local_34 [3];
  char local_31;
  
  fd = pci_open_resource(pci_addr,"config",0);
  uVar1 = read_io16(fd,0);
  uVar2 = read_io16(fd,2);
  sVar3 = pread(fd,local_34,4,8);
  if (sVar3 != 4) {
    fprintf(_stderr,"[ERROR] %s:%d %s(): pread io resource\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/device.h",
            0xa2,"read_io32");
    abort();
  }
  close(fd);
  if (local_31 == '\x02') {
    if ((uVar1 == 0x1af4) && (0xfff < uVar2)) {
      piVar4 = virtio_init(pci_addr,rx_queues,tx_queues);
      return piVar4;
    }
    piVar4 = ixgbe_init(pci_addr,rx_queues,tx_queues,interrupt_timeout);
    return piVar4;
  }
  fprintf(_stderr,"[ERROR] %s:%d %s(): Device %s is not a NIC\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/device.c",
          0x14,"ixy_init",pci_addr);
  abort();
}

Assistant:

struct ixy_device* ixy_init(const char* pci_addr, uint16_t rx_queues, uint16_t tx_queues, int interrupt_timeout) {
	// Read PCI configuration space
	// For VFIO, we could access the config space another way
	// (VFIO_PCI_CONFIG_REGION_INDEX). This is not needed, though, because
	// every config file should be world-readable, and here we
	// only read the vendor and device id.
	int config = pci_open_resource(pci_addr, "config", O_RDONLY);
	uint16_t vendor_id = read_io16(config, 0);
	uint16_t device_id = read_io16(config, 2);
	uint32_t class_id = read_io32(config, 8) >> 24;
	close(config);
	if (class_id != 2) {
		error("Device %s is not a NIC", pci_addr);
	}
	if (vendor_id == 0x1af4 && device_id >= 0x1000) {
		return virtio_init(pci_addr, rx_queues, tx_queues);
	} else {
		// Our best guess is to try ixgbe
		return ixgbe_init(pci_addr, rx_queues, tx_queues, interrupt_timeout);
	}
}